

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quant_levels_dec_utils.c
# Opt level: O0

void ApplyFilter(SmoothParams *p)

{
  int iVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  uint8_t uVar5;
  uint uVar6;
  int *in_RDI;
  int c;
  int v;
  int x;
  uint8_t *dst;
  int16_t *correction;
  int w;
  uint16_t *average;
  int local_2c;
  
  lVar2 = *(long *)(in_RDI + 0x14);
  iVar1 = *in_RDI;
  lVar3 = *(long *)(in_RDI + 0x1a);
  lVar4 = *(long *)(in_RDI + 6);
  for (local_2c = 0; local_2c < iVar1; local_2c = local_2c + 1) {
    uVar6 = (uint)*(byte *)(lVar4 + local_2c);
    if (((int)uVar6 < in_RDI[0x18]) && (in_RDI[0x17] < (int)uVar6)) {
      uVar5 = clip_8b(uVar6 + (int)*(short *)(lVar3 + (long)(int)((uint)*(ushort *)
                                                                         (lVar2 + (long)local_2c * 2
                                                                         ) + uVar6 * -4) * 2));
      *(uint8_t *)(lVar4 + local_2c) = uVar5;
    }
  }
  *(long *)(in_RDI + 6) = *(long *)(in_RDI + 6) + (long)in_RDI[2];
  return;
}

Assistant:

static void ApplyFilter(SmoothParams* const p) {
  const uint16_t* const average = p->average_;
  const int w = p->width_;
  const int16_t* const correction = p->correction_;
#if defined(USE_DITHERING)
  const uint8_t* const dither = kOrderedDither[p->row_ % DSIZE];
#endif
  uint8_t* const dst = p->dst_;
  int x;
  for (x = 0; x < w; ++x) {
    const int v = dst[x];
    if (v < p->max_ && v > p->min_) {
      const int c = (v << DFIX) + correction[average[x] - (v << LFIX)];
#if defined(USE_DITHERING)
      dst[x] = clip_8b(c + dither[x % DSIZE]);
#else
      dst[x] = clip_8b(c);
#endif
    }
  }
  p->dst_ += p->stride_;  // advance output pointer
}